

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O2

void __thiscall
SDL2pp::Surface::Blit(Surface *this,Optional<Rect> *srcrect,Surface *dst,Rect *dstrect)

{
  SDL_Surface *pSVar1;
  int iVar2;
  value_type *pvVar3;
  Exception *this_00;
  SDL_Rect tmpdstrect;
  
  tmpdstrect.x = (dstrect->super_SDL_Rect).x;
  tmpdstrect.y = (dstrect->super_SDL_Rect).y;
  tmpdstrect.w = (dstrect->super_SDL_Rect).w;
  tmpdstrect.h = (dstrect->super_SDL_Rect).h;
  pSVar1 = this->surface_;
  if ((srcrect->super___optional_storage<SDL2pp::Rect,_true>).__engaged_ == true) {
    pvVar3 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(srcrect);
  }
  else {
    pvVar3 = (value_type *)0x0;
  }
  iVar2 = SDL_UpperBlit(pSVar1,pvVar3,dst->surface_,&tmpdstrect);
  if (iVar2 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_BlitSurface");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Surface::Blit(const Optional<Rect>& srcrect, Surface& dst, const Rect& dstrect) {
	SDL_Rect tmpdstrect = dstrect; // 4th argument is non-const; does it modify rect?
	if (SDL_BlitSurface(surface_, srcrect ? &*srcrect : nullptr, dst.Get(), &tmpdstrect) != 0)
		throw Exception("SDL_BlitSurface");
}